

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void pugi::impl::anon_unknown_0::text_output_indent
               (xml_buffered_writer *writer,char_t *indent,size_t indent_length,uint depth)

{
  uint *__n;
  void *extraout_RDX;
  bool bVar1;
  
  __n = &switchD_0010f0f7::switchdataD_00114318;
  switch(indent_length) {
  case 1:
    while (bVar1 = depth != 0, depth = depth - 1, bVar1) {
      xml_buffered_writer::write(writer,(uint)*indent,(void *)indent_length,(size_t)__n);
      indent_length = (size_t)extraout_RDX;
    }
    break;
  case 2:
    while (bVar1 = depth != 0, depth = depth - 1, bVar1) {
      xml_buffered_writer::write(writer,(uint)*indent,(void *)(ulong)indent[1],(size_t)__n);
    }
    break;
  case 3:
    while (bVar1 = depth != 0, depth = depth - 1, bVar1) {
      xml_buffered_writer::write(writer,(uint)*indent,(void *)(ulong)indent[1],(ulong)indent[2]);
    }
    break;
  case 4:
    while (bVar1 = depth != 0, depth = depth - 1, bVar1) {
      xml_buffered_writer::write(writer,(uint)*indent,(void *)(ulong)indent[1],(ulong)indent[2]);
    }
    break;
  default:
    while (bVar1 = depth != 0, depth = depth - 1, bVar1) {
      xml_buffered_writer::write_buffer(writer,indent,indent_length);
    }
  }
  return;
}

Assistant:

PUGI__FN void text_output_indent(xml_buffered_writer& writer, const char_t* indent, size_t indent_length, unsigned int depth)
	{
		switch (indent_length)
		{
		case 1:
		{
			for (unsigned int i = 0; i < depth; ++i)
				writer.write(indent[0]);
			break;
		}

		case 2:
		{
			for (unsigned int i = 0; i < depth; ++i)
				writer.write(indent[0], indent[1]);
			break;
		}

		case 3:
		{
			for (unsigned int i = 0; i < depth; ++i)
				writer.write(indent[0], indent[1], indent[2]);
			break;
		}

		case 4:
		{
			for (unsigned int i = 0; i < depth; ++i)
				writer.write(indent[0], indent[1], indent[2], indent[3]);
			break;
		}

		default:
		{
			for (unsigned int i = 0; i < depth; ++i)
				writer.write_buffer(indent, indent_length);
		}
		}
	}